

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int find_next_scenecut(FIRSTPASS_STATS *stats_start,int first,int last)

{
  double *pdVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double temp_ratio;
  int j;
  double temp_intra;
  int i;
  double max_next_coded;
  double max_prev_coded;
  double max_next_ratio;
  double max_prev_ratio;
  double this_ratio;
  double local_e0;
  double local_d0;
  double local_c0;
  double local_b0;
  double local_a8;
  int local_a0;
  double local_98;
  int local_8c;
  double local_88;
  double local_78;
  int local_64;
  int local_54;
  int local_44;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double max_sr_fr_ratio;
  double max_sr;
  double temp_ratio_1;
  int j_1;
  
  local_44 = in_ESI;
  if (in_EDX != in_ESI) {
    for (; local_44 <= in_EDX; local_44 = local_44 + 1) {
      if ((*(long *)(in_RDI + (long)local_44 * 0xe8 + 0xc0) == 0) &&
         ((local_44 < 1 || (*(long *)(in_RDI + (long)(local_44 + -1) * 0xe8 + 0xc0) == 0)))) {
        if (*(double *)(in_RDI + (long)local_44 * 0xe8 + 0x10) <= 0.01) {
          local_88 = 0.01;
        }
        else {
          local_88 = *(double *)(in_RDI + (long)local_44 * 0xe8 + 0x10);
        }
        local_88 = *(double *)(in_RDI + (long)local_44 * 0xe8 + 0x20) / local_88;
        local_28 = 0.0;
        local_38 = 0.0;
        local_8c = in_ESI;
        if (in_ESI <= local_44 + -3) {
          local_8c = local_44 + -3;
        }
        for (local_54 = local_8c; local_54 < local_44; local_54 = local_54 + 1) {
          if ((*(long *)(in_RDI + (long)local_54 * 0xe8 + 0xc0) == 0) &&
             ((local_54 < 1 || (*(long *)(in_RDI + (long)(local_54 + -1) * 0xe8 + 0xc0) == 0)))) {
            if (*(double *)(in_RDI + (long)local_54 * 0xe8 + 0x10) <= 0.01) {
              local_98 = 0.01;
            }
            else {
              local_98 = *(double *)(in_RDI + (long)local_54 * 0xe8 + 0x10);
            }
            local_98 = *(double *)(in_RDI + (long)local_54 * 0xe8 + 0x20) / local_98;
            if (local_28 < local_98) {
              local_28 = local_98;
            }
            if (local_38 < *(double *)(in_RDI + (long)local_54 * 0xe8 + 0x20)) {
              local_38 = *(double *)(in_RDI + (long)local_54 * 0xe8 + 0x20);
            }
          }
        }
        local_30 = 0.0;
        local_40 = 0.0;
        local_64 = local_44;
        while( true ) {
          local_64 = local_64 + 1;
          local_a0 = in_EDX;
          if (local_44 + 3 < in_EDX) {
            local_a0 = local_44 + 3;
          }
          if (local_a0 < local_64) break;
          if ((*(long *)(in_RDI + (long)local_44 * 0xe8 + 0xc0) == 0) &&
             ((local_44 < 1 || (*(long *)(in_RDI + (long)(local_44 + -1) * 0xe8 + 0xc0) == 0)))) {
            if (*(double *)(in_RDI + (long)local_64 * 0xe8 + 0x10) <= 0.01) {
              local_a8 = 0.01;
            }
            else {
              local_a8 = *(double *)(in_RDI + (long)local_64 * 0xe8 + 0x10);
            }
            local_a8 = *(double *)(in_RDI + (long)local_64 * 0xe8 + 0x20) / local_a8;
            if (local_30 < local_a8) {
              local_30 = local_a8;
            }
            if (local_40 < *(double *)(in_RDI + (long)local_64 * 0xe8 + 0x20)) {
              local_40 = *(double *)(in_RDI + (long)local_64 * 0xe8 + 0x20);
            }
          }
        }
        if ((0.001 <= local_28) || (0.001 <= local_30)) {
          local_b0 = *(double *)(in_RDI + (long)local_44 * 0xe8 + 0x28);
          local_78 = local_b0;
          if (local_44 < in_EDX) {
            pdVar1 = (double *)(in_RDI + (long)(local_44 + 1) * 0xe8 + 0x28);
            if (local_b0 < *pdVar1 || local_b0 == *pdVar1) {
              local_b0 = *(double *)(in_RDI + (long)(local_44 + 1) * 0xe8 + 0x28);
            }
            local_78 = local_b0;
          }
          if (*(double *)(in_RDI + (long)local_44 * 0xe8 + 0x20) <= 0.01) {
            local_c0 = 0.01;
          }
          else {
            local_c0 = *(double *)(in_RDI + (long)local_44 * 0xe8 + 0x20);
          }
          if (local_78 / local_c0 <= 1.2) {
            if (local_28 <= local_30) {
              local_d0 = local_30;
            }
            else {
              local_d0 = local_28;
            }
            if (local_d0 * 2.0 <= local_88) {
              return local_44;
            }
            if (local_38 <= local_40) {
              local_e0 = local_40;
            }
            else {
              local_e0 = local_38;
            }
            if (local_e0 * 2.0 <= *(double *)(in_RDI + (long)local_44 * 0xe8 + 0x20)) {
              return local_44;
            }
          }
        }
        else if (0.02 <= local_88) {
          return local_44;
        }
      }
    }
  }
  return -1;
}

Assistant:

static int find_next_scenecut(const FIRSTPASS_STATS *const stats_start,
                              int first, int last) {
  // Identify unstable areas caused by scenecuts.
  // Find the max and 2nd max coded error, and the average of the rest frames.
  // If there is only one frame that yields a huge coded error, it is likely a
  // scenecut.
  double this_ratio, max_prev_ratio, max_next_ratio, max_prev_coded,
      max_next_coded;

  if (last - first == 0) return -1;

  for (int i = first; i <= last; i++) {
    if (stats_start[i].is_flash || (i > 0 && stats_start[i - 1].is_flash))
      continue;
    double temp_intra = AOMMAX(stats_start[i].intra_error, 0.01);
    this_ratio = stats_start[i].coded_error / temp_intra;
    // find the avg ratio in the preceding neighborhood
    max_prev_ratio = 0;
    max_prev_coded = 0;
    for (int j = AOMMAX(first, i - HALF_WIN); j < i; j++) {
      if (stats_start[j].is_flash || (j > 0 && stats_start[j - 1].is_flash))
        continue;
      temp_intra = AOMMAX(stats_start[j].intra_error, 0.01);
      double temp_ratio = stats_start[j].coded_error / temp_intra;
      if (temp_ratio > max_prev_ratio) {
        max_prev_ratio = temp_ratio;
      }
      if (stats_start[j].coded_error > max_prev_coded) {
        max_prev_coded = stats_start[j].coded_error;
      }
    }
    // find the avg ratio in the following neighborhood
    max_next_ratio = 0;
    max_next_coded = 0;
    for (int j = i + 1; j <= AOMMIN(i + HALF_WIN, last); j++) {
      if (stats_start[i].is_flash || (i > 0 && stats_start[i - 1].is_flash))
        continue;
      temp_intra = AOMMAX(stats_start[j].intra_error, 0.01);
      double temp_ratio = stats_start[j].coded_error / temp_intra;
      if (temp_ratio > max_next_ratio) {
        max_next_ratio = temp_ratio;
      }
      if (stats_start[j].coded_error > max_next_coded) {
        max_next_coded = stats_start[j].coded_error;
      }
    }

    if (max_prev_ratio < 0.001 && max_next_ratio < 0.001) {
      // the ratios are very small, only check a small fixed threshold
      if (this_ratio < 0.02) continue;
    } else {
      // check if this frame has a larger ratio than the neighborhood
      double max_sr = stats_start[i].sr_coded_error;
      if (i < last) max_sr = AOMMAX(max_sr, stats_start[i + 1].sr_coded_error);
      double max_sr_fr_ratio =
          max_sr / AOMMAX(stats_start[i].coded_error, 0.01);

      if (max_sr_fr_ratio > 1.2) continue;
      if (this_ratio < 2 * AOMMAX(max_prev_ratio, max_next_ratio) &&
          stats_start[i].coded_error <
              2 * AOMMAX(max_prev_coded, max_next_coded)) {
        continue;
      }
    }
    return i;
  }
  return -1;
}